

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O2

bool __thiscall Jinx::Impl::Script::IsIntegerPair(Script *this,Variant *value)

{
  long lVar1;
  bool bVar2;
  CollectionPtr coll;
  undefined1 local_18 [16];
  
  if (value->m_type == Collection) {
    Jinx::Variant::GetCollection((Variant *)local_18);
    if ((*(long *)(local_18._0_8_ + 0x28) == 2) &&
       (*(int *)(*(long *)(local_18._0_8_ + 0x18) + 0x20) == 2)) {
      lVar1 = std::_Rb_tree_decrement((_Rb_tree_node_base *)(local_18._0_8_ + 8));
      bVar2 = *(int *)(lVar1 + 0x20) == 2;
    }
    else {
      bVar2 = false;
    }
    Catch::clara::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_18 + 8));
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool IsCollection() const { return m_type == ValueType::Collection ? true : false; }